

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O2

void Assimp::GetArrayCopy<aiColor4t<float>>(aiColor4t<float> **dest,ai_uint num)

{
  aiColor4t<float> *__src;
  aiColor4t<float> *__dest;
  
  __src = *dest;
  if (__src != (aiColor4t<float> *)0x0) {
    __dest = (aiColor4t<float> *)operator_new__((ulong)num << 4);
    *dest = __dest;
    memcpy(__dest,__src,(ulong)num << 4);
    return;
  }
  return;
}

Assistant:

inline
void GetArrayCopy(Type*& dest, ai_uint num ) {
    if ( !dest ) {
        return;
    }
    Type* old = dest;

    dest = new Type[num];
    ::memcpy(dest, old, sizeof(Type) * num);
}